

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles31::Functional::PackSnorm4x8Case::iterate(PackSnorm4x8Case *this)

{
  ostringstream *poVar1;
  ShaderExecutor *pSVar2;
  PackSnorm4x8Case *pPVar3;
  deUint32 dVar4;
  char *description;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  int extraout_XMM0_Db;
  float fVar17;
  int extraout_XMM0_Dc;
  float fVar18;
  int extraout_XMM0_Dd;
  float fVar19;
  undefined1 auVar16 [16];
  uint uVar20;
  uint uVar24;
  uint uVar25;
  undefined1 auVar21 [16];
  uint uVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  undefined1 local_268 [16];
  long local_258;
  int local_244;
  PackSnorm4x8Case *local_240;
  pointer local_238;
  int aiStack_230 [2];
  float local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  float local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  float local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  ulong local_1e0;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  _func_int **app_Stack_1b0 [14];
  ios_base local_140 [272];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c8,dVar4 ^ 0x42f2c0);
  local_258 = 0;
  local_268 = (undefined1  [16])0x0;
  local_1e8 = (pointer)0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_244 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    local_244 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  local_1b8._0_4_ = 0.0;
  local_1b8._4_4_ = 0.0;
  app_Stack_1b0[0]._0_4_ = 0.0;
  app_Stack_1b0[0]._4_4_ = 0.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f800000bf800000;
  app_Stack_1b0[0] = (_func_int **)0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf0000003f000000;
  app_Stack_1b0[0] = (_func_int **)0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3fc00000bfc00000;
  app_Stack_1b0[0] = (_func_int **)0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf4000003e800000;
  app_Stack_1b0[0] = (_func_int **)0x3f400000be800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
             (Vector<float,_4> *)local_1b8);
  iVar5 = 0xf;
  do {
    fVar15 = deRandom_getFloat(&local_1c8);
    local_208 = fVar15 * 2.5 + -1.25;
    fVar15 = deRandom_getFloat(&local_1c8);
    local_218 = fVar15 * 2.5 + -1.25;
    local_228 = deRandom_getFloat(&local_1c8);
    fVar15 = deRandom_getFloat(&local_1c8);
    app_Stack_1b0[0] = (_func_int **)CONCAT44(fVar15 * 2.5 + -1.25,local_228 * 2.5 + -1.25);
    local_1b8._4_4_ = local_218;
    local_1b8._0_4_ = local_208;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
               (Vector<float,_4> *)local_1b8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = 0x50;
  do {
    fVar15 = deRandom_getFloat(&local_1c8);
    local_208 = fVar15 * 1e+06 + -500000.0;
    fVar15 = deRandom_getFloat(&local_1c8);
    local_218 = fVar15 * 1e+06 + -500000.0;
    local_228 = deRandom_getFloat(&local_1c8);
    iStack_224 = extraout_XMM0_Db;
    iStack_220 = extraout_XMM0_Dc;
    iStack_21c = extraout_XMM0_Dd;
    fVar15 = deRandom_getFloat(&local_1c8);
    app_Stack_1b0[0] =
         (_func_int **)CONCAT44(fVar15 * 1e+06 + -500000.0,local_228 * 1e+06 + -500000.0);
    local_1b8._4_4_ = local_218;
    local_1b8._0_4_ = local_208;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_268,
               (Vector<float,_4> *)local_1b8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f8,
             (long)(local_268._8_8_ - local_268._0_8_) >> 4);
  local_1b8 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_268._0_8_;
  local_238 = (pointer)local_1f8._0_8_;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar2->_vptr_ShaderExecutor[6])
            (pSVar2,(ulong)(local_268._8_8_ - local_268._0_8_) >> 4,local_1b8,&local_238);
  local_1e0 = (ulong)(local_268._8_8_ - local_268._0_8_) >> 4;
  uVar8 = (uint)local_1e0;
  local_240 = this;
  if ((int)uVar8 < 1) {
    iVar5 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    lVar6 = 0;
    uVar7 = 0;
    iVar5 = 0;
    local_1d8 = local_244;
    iStack_1d4 = local_244;
    iStack_1d0 = local_244;
    iStack_1cc = local_244;
    iVar9 = local_244;
    iVar28 = local_244;
    iVar29 = local_244;
    iVar30 = local_244;
    do {
      auVar16 = *(undefined1 (*) [16])(local_268._0_8_ + lVar6);
      auVar21._8_4_ = 0x3f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._12_4_ = 0x3f800000;
      auVar21 = minps(auVar21,auVar16);
      uVar10 = -(uint)(auVar16._0_4_ < -1.0);
      uVar11 = -(uint)(auVar16._4_4_ < -1.0);
      uVar12 = -(uint)(auVar16._8_4_ < -1.0);
      uVar13 = -(uint)(auVar16._12_4_ < -1.0);
      fVar15 = (float)(uVar10 & 0xc2fe0000 | ~uVar10 & (uint)(auVar21._0_4_ * 127.0));
      fVar17 = (float)(uVar11 & 0xc2fe0000 | ~uVar11 & (uint)(auVar21._4_4_ * 127.0));
      fVar18 = (float)(uVar12 & 0xc2fe0000 | ~uVar12 & (uint)(auVar21._8_4_ * 127.0));
      fVar19 = (float)(uVar13 & 0xc2fe0000 | ~uVar13 & (uint)(auVar21._12_4_ * 127.0));
      uVar11 = -(uint)(fVar15 < 0.0);
      uVar12 = -(uint)(fVar17 < 0.0);
      uVar13 = -(uint)(fVar18 < 0.0);
      uVar14 = -(uint)(fVar19 < 0.0);
      uVar10 = *(uint *)(local_1f8._0_8_ + uVar7 * 4);
      uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar15);
      uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar17);
      uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar18);
      uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar19);
      uVar20 = -(uint)((int)uVar11 < 0x7f);
      uVar24 = -(uint)((int)uVar12 < 0x7f);
      uVar25 = -(uint)((int)uVar13 < 0x7f);
      uVar26 = -(uint)((int)uVar14 < 0x7f);
      uVar11 = ~uVar20 & 0x7f | uVar11 & uVar20;
      uVar12 = ~uVar24 & 0x7f | uVar12 & uVar24;
      uVar13 = ~uVar25 & 0x7f | uVar13 & uVar25;
      uVar14 = ~uVar26 & 0x7f | uVar14 & uVar26;
      uVar20 = -(uint)(-0x80 < (int)uVar11);
      uVar24 = -(uint)(-0x80 < (int)uVar12);
      uVar25 = -(uint)(-0x80 < (int)uVar13);
      uVar26 = -(uint)(-0x80 < (int)uVar14);
      local_218 = (float)(~uVar20 & 0xffffff80 | uVar11 & uVar20);
      uStack_214 = ~uVar24 & 0xffffff80 | uVar12 & uVar24;
      uStack_210 = ~uVar25 & 0xffffff80 | uVar13 & uVar25;
      uStack_20c = ~uVar26 & 0xffffff80 | uVar14 & uVar26;
      local_208 = (float)((uint)local_218 & 0xff);
      uStack_204 = uStack_214 & 0xff;
      uStack_200 = uStack_210 & 0xff;
      uStack_1fc = uStack_20c & 0xff;
      uVar20 = (int)local_208 - (uVar10 & 0xff);
      uVar24 = uStack_204 - (uVar10 >> 8 & 0xff);
      uVar25 = uStack_200 - (uVar10 >> 0x10 & 0xff);
      uVar26 = uStack_1fc - (uVar10 >> 0x18);
      uVar11 = (int)uVar20 >> 0x1f;
      uVar12 = (int)uVar24 >> 0x1f;
      uVar13 = (int)uVar25 >> 0x1f;
      uVar14 = (int)uVar26 >> 0x1f;
      local_228 = (float)((uVar20 ^ uVar11) - uVar11);
      iStack_224 = (uVar24 ^ uVar12) - uVar12;
      iStack_220 = (uVar25 ^ uVar13) - uVar13;
      iStack_21c = (uVar26 ^ uVar14) - uVar14;
      auVar16._0_4_ = -(uint)(iVar9 < (int)local_228);
      auVar16._4_4_ = -(uint)(iVar28 < iStack_224);
      auVar16._8_4_ = -(uint)(iVar29 < iStack_220);
      auVar16._12_4_ = -(uint)(iVar30 < iStack_21c);
      auVar22._4_4_ = auVar16._4_4_;
      auVar22._0_4_ = auVar16._4_4_;
      auVar22._8_4_ = auVar16._4_4_;
      auVar22._12_4_ = auVar16._4_4_;
      auVar27._4_4_ = auVar16._12_4_;
      auVar27._0_4_ = auVar16._8_4_;
      auVar27._8_4_ = auVar16._8_4_;
      auVar27._12_4_ = auVar16._12_4_;
      auVar23._4_4_ = auVar16._12_4_;
      auVar23._0_4_ = auVar16._12_4_;
      auVar23._8_4_ = auVar16._12_4_;
      auVar23._12_4_ = auVar16._12_4_;
      if (((auVar23 | auVar16 | auVar27 | auVar22) & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        if (iVar5 < 10) {
          local_1b8 = (undefined1  [8])
                      ((local_240->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,", expected packSnorm4x8(",0x18);
          tcu::operator<<((ostream *)poVar1,(Vector<float,_4> *)(local_268._0_8_ + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          local_238 = (pointer)(ulong)((uint)local_208 |
                                      uStack_204 << 8 | uStack_200 << 0x10 | uStack_214 << 0x18);
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_238,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
          local_238 = (pointer)(ulong)uVar10;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_238,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n  diffs = ",0xb);
          local_238 = (pointer)CONCAT44(iStack_224,local_228);
          aiStack_230[1] = iStack_21c;
          aiStack_230[0] = iStack_220;
          tcu::operator<<((ostream *)poVar1,(Vector<int,_4> *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", max diff = ",0xd);
          std::ostream::operator<<(poVar1,local_244);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_140);
          iVar9 = local_1d8;
          iVar28 = iStack_1d4;
          iVar29 = iStack_1d0;
          iVar30 = iStack_1cc;
        }
        else if (iVar5 == 10) {
          local_1b8 = (undefined1  [8])
                      ((local_240->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
          std::ios_base::~ios_base(local_140);
          iVar9 = local_1d8;
          iVar28 = iStack_1d4;
          iVar29 = iStack_1d0;
          iVar30 = iStack_1cc;
        }
        iVar5 = iVar5 + 1;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  pPVar3 = local_240;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8 = (undefined1  [8])
              ((local_240->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar9 = (int)local_1e0;
  std::ostream::operator<<(poVar1,iVar9 - iVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  description = "Pass";
  if (iVar5 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pPVar3->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar5 != 0),description);
  if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
  }
  if ((void *)local_268._0_8_ != (void *)0x0) {
    operator_delete((void *)local_268._0_8_,local_258 - local_268._0_8_);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}